

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QUuid __thiscall QVariant::toUuid(QVariant *this)

{
  QUuid QVar1;
  
  QVar1 = qvariant_cast<QUuid>(this);
  return QVar1;
}

Assistant:

QUuid QVariant::toUuid() const
{
    return qvariant_cast<QUuid>(*this);
}